

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

bool jsonip::parser::star_<jsonip::grammar::space>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *state)

{
  bool bVar1;
  
  while( true ) {
    bVar1 = or_<jsonip::parser::char_<(char)32>,jsonip::parser::char_<(char)9>,jsonip::parser::new_line,jsonip::parser::char_<(char)13>,jsonip::grammar::comment_,jsonip::grammar::ccomment_,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
            ::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                      (state);
    if (!bVar1) {
      return true;
    }
    bVar1 = or_<jsonip::parser::char_<(char)32>,jsonip::parser::char_<(char)9>,jsonip::parser::new_line,jsonip::parser::char_<(char)13>,jsonip::grammar::comment_,jsonip::grammar::ccomment_,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
            ::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                      (state);
    if (!bVar1) {
      return true;
    }
    bVar1 = or_<jsonip::parser::char_<(char)32>,jsonip::parser::char_<(char)9>,jsonip::parser::new_line,jsonip::parser::char_<(char)13>,jsonip::grammar::comment_,jsonip::grammar::ccomment_,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
            ::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                      (state);
    if (!bVar1) {
      return true;
    }
    bVar1 = or_<jsonip::parser::char_<(char)32>,jsonip::parser::char_<(char)9>,jsonip::parser::new_line,jsonip::parser::char_<(char)13>,jsonip::grammar::comment_,jsonip::grammar::ccomment_,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
            ::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                      (state);
    if (!bVar1) {
      return true;
    }
    bVar1 = or_<jsonip::parser::char_<(char)32>,jsonip::parser::char_<(char)9>,jsonip::parser::new_line,jsonip::parser::char_<(char)13>,jsonip::grammar::comment_,jsonip::grammar::ccomment_,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
            ::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                      (state);
    if (!bVar1) {
      return true;
    }
    bVar1 = or_<jsonip::parser::char_<(char)32>,jsonip::parser::char_<(char)9>,jsonip::parser::new_line,jsonip::parser::char_<(char)13>,jsonip::grammar::comment_,jsonip::grammar::ccomment_,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
            ::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                      (state);
    if (!bVar1) {
      return true;
    }
    bVar1 = or_<jsonip::parser::char_<(char)32>,jsonip::parser::char_<(char)9>,jsonip::parser::new_line,jsonip::parser::char_<(char)13>,jsonip::grammar::comment_,jsonip::grammar::ccomment_,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
            ::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                      (state);
    if (!bVar1) {
      return true;
    }
    bVar1 = or_<jsonip::parser::char_<(char)32>,jsonip::parser::char_<(char)9>,jsonip::parser::new_line,jsonip::parser::char_<(char)13>,jsonip::grammar::comment_,jsonip::grammar::ccomment_,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
            ::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                      (state);
    if (!bVar1) break;
    bVar1 = or_<jsonip::parser::char_<(char)32>,jsonip::parser::char_<(char)9>,jsonip::parser::new_line,jsonip::parser::char_<(char)13>,jsonip::grammar::comment_,jsonip::grammar::ccomment_,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
            ::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                      (state);
    if (!bVar1) {
      return true;
    }
    bVar1 = or_<jsonip::parser::char_<(char)32>,jsonip::parser::char_<(char)9>,jsonip::parser::new_line,jsonip::parser::char_<(char)13>,jsonip::grammar::comment_,jsonip::grammar::ccomment_,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
            ::
            match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                      (state);
    if (!bVar1) {
      return true;
    }
  }
  return true;
}

Assistant:

static inline bool match(S& state)
        {
            while (C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state) && C0::match(state) && C0::match(state) &&
                   C0::match(state))
                ;
            return true;
        }